

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O0

void __thiscall
lsim::LSimContext::load_reference_library(LSimContext *this,char *name,char *filename)

{
  pointer ppSVar1;
  bool bVar2;
  pointer lib_00;
  char *pcVar3;
  mapped_type *this_00;
  allocator local_d9;
  string local_d8 [32];
  uint local_b8;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [40];
  __single_object lib;
  string local_48 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
  local_28;
  pointer local_20;
  char *filename_local;
  char *name_local;
  LSimContext *this_local;
  
  local_20 = (pointer)filename;
  filename_local = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,name,(allocator *)&stack0xffffffffffffffb7);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>_>
       ::find(&this->m_reference_libraries,(key_type *)local_48);
  lib._M_t.
  super___uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>.
  _M_t.
  super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
  .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl =
       (__uniq_ptr_data<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>,_true,_true>
        )std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>_>
         ::end(&this->m_reference_libraries);
  bVar2 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
                      *)&lib);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  if (!bVar2) {
    std::make_unique<lsim::ModelCircuitLibrary,char_const*&,char_const*&>
              ((char **)(local_90 + 0x20),&filename_local);
    lib_00 = std::
             unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
             ::get((unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                    *)(local_90 + 0x20));
    ppSVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,(char *)ppSVar1,&local_b1);
    full_file_path((LSimContext *)local_90,(string *)this);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = deserialize_library(this,lib_00,pcVar3);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    pcVar3 = filename_local;
    bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (bVar2) {
      std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
      operator=((unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                 *)(local_90 + 0x20),(nullptr_t)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar3,&local_d9);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>_>
                ::operator[](&this->m_reference_libraries,(key_type *)local_d8);
      std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
      operator=(this_00,(unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                         *)(local_90 + 0x20));
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    local_b8 = (uint)bVar2;
    std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
    ~unique_ptr((unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                 *)(local_90 + 0x20));
  }
  return;
}

Assistant:

void LSimContext::load_reference_library(const char *name, const char *filename) {
    if (m_reference_libraries.find(name) != m_reference_libraries.end()) {
        return;
    }

    auto lib = std::make_unique<ModelCircuitLibrary>(name, filename);
    if (!deserialize_library(this, lib.get(), full_file_path(filename).c_str())) {
        lib = nullptr;
        return;
    }

    m_reference_libraries[name] = std::move(lib);
}